

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

bool google::protobuf::compiler::java::anon_unknown_7::EqualWithSuffix
               (string_view name1,string_view suffix,string_view name2)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  string_view expected;
  size_t local_20;
  char *local_18;
  
  expected._M_str = suffix._M_str;
  local_18 = name2._M_str;
  local_20 = name2._M_len;
  expected._M_len = (size_t)expected._M_str;
  bVar1 = absl::lts_20250127::ConsumeSuffix
                    ((lts_20250127 *)&local_20,(Nonnull<absl::string_view_*>)suffix._M_len,expected)
  ;
  if (bVar1) {
    __y._M_str = local_18;
    __y._M_len = local_20;
    bVar1 = std::operator==(name1,__y);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool EqualWithSuffix(absl::string_view name1, absl::string_view suffix,
                     absl::string_view name2) {
  if (!absl::ConsumeSuffix(&name2, suffix)) return false;
  return name1 == name2;
}